

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O2

FString __thiscall Stat_psprites::GetStats(Stat_psprites *this)

{
  DPSprite *pDVar1;
  TObjPtr<DPSprite> *obj;
  int i;
  ulong uVar2;
  
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  (this->super_FStat)._vptr_FStat = (_func_int **)0x7ff1bc;
  for (uVar2 = 0; uVar2 != 8; uVar2 = uVar2 + 1) {
    if (playeringame[uVar2] == true) {
      FString::AppendFormat((FString *)this,"[psprites] player: %d | layers: ",uVar2 & 0xffffffff);
      obj = (TObjPtr<DPSprite> *)(&DAT_009ba500 + uVar2 * 0x2a0);
      while( true ) {
        pDVar1 = GC::ReadBarrier<DPSprite>((DPSprite **)obj);
        if (pDVar1 == (DPSprite *)0x0) break;
        FString::AppendFormat((FString *)this,"%d, ",(ulong)(uint)pDVar1->ID);
        obj = &pDVar1->Next;
      }
      FString::AppendFormat((FString *)this,"\n");
    }
  }
  return (FString)(char *)this;
}

Assistant:

ADD_STAT(psprites)
{
	FString out;
	DPSprite *pspr;
	for (int i = 0; i < MAXPLAYERS; i++)
	{
		if (!playeringame[i])
			continue;

		out.AppendFormat("[psprites] player: %d | layers: ", i);

		pspr = players[i].psprites;
		while (pspr)
		{
			out.AppendFormat("%d, ", pspr->GetID());

			pspr = pspr->GetNext();
		}

		out.AppendFormat("\n");
	}

	return out;
}